

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void YuvToRgbRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  uint8_t *y_00;
  uint uVar1;
  long lVar2;
  byte *u_00;
  long lVar3;
  byte *v_00;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i rgb0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i G3;
  __m128i G2;
  __m128i G1;
  __m128i G0;
  __m128i R3;
  __m128i R2;
  __m128i R1;
  __m128i R0;
  char local_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char local_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    u_00 = u + lVar3;
    v_00 = v + lVar3;
    if (len < (int)lVar2 + 0x20) break;
    y_00 = y + lVar2;
    YUV420ToRGB_SSE2(y_00,u_00,v_00,(__m128i *)&local_48,(__m128i *)&local_88,(__m128i *)&local_c8);
    YUV420ToRGB_SSE2(y_00 + 8,u + lVar3 + 4,v + lVar3 + 4,(__m128i *)&local_58,(__m128i *)&local_98,
                     (__m128i *)&local_d8);
    YUV420ToRGB_SSE2(y_00 + 0x10,u + lVar3 + 8,v + lVar3 + 8,(__m128i *)&local_68,
                     (__m128i *)&local_a8,(__m128i *)&local_e8);
    YUV420ToRGB_SSE2(y_00 + 0x18,u + lVar3 + 0xc,v + lVar3 + 0xc,(__m128i *)&local_78,
                     (__m128i *)&local_b8,(__m128i *)&local_f8);
    local_108 = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
    cStack_107 = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    cStack_106 = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    cStack_105 = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
    cStack_104 = (0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 - (0xff < sStack_40);
    cStack_103 = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
    cStack_102 = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
    cStack_101 = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    cStack_100 = (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58);
    cStack_ff = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
    cStack_fe = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    cStack_fd = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
    cStack_fc = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
    cStack_fb = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    cStack_fa = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    cStack_f9 = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    local_118 = (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68);
    cStack_117 = (0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66);
    cStack_116 = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
    cStack_115 = (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62);
    cStack_114 = (0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60);
    cStack_113 = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
    cStack_112 = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
    cStack_111 = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    cStack_110 = (0 < local_78) * (local_78 < 0x100) * (char)local_78 - (0xff < local_78);
    cStack_10f = (0 < sStack_76) * (sStack_76 < 0x100) * (char)sStack_76 - (0xff < sStack_76);
    cStack_10e = (0 < sStack_74) * (sStack_74 < 0x100) * (char)sStack_74 - (0xff < sStack_74);
    cStack_10d = (0 < sStack_72) * (sStack_72 < 0x100) * (char)sStack_72 - (0xff < sStack_72);
    cStack_10c = (0 < sStack_70) * (sStack_70 < 0x100) * (char)sStack_70 - (0xff < sStack_70);
    cStack_10b = (0 < sStack_6e) * (sStack_6e < 0x100) * (char)sStack_6e - (0xff < sStack_6e);
    cStack_10a = (0 < sStack_6c) * (sStack_6c < 0x100) * (char)sStack_6c - (0xff < sStack_6c);
    cStack_109 = (0 < sStack_6a) * (sStack_6a < 0x100) * (char)sStack_6a - (0xff < sStack_6a);
    local_128 = (0 < local_88) * (local_88 < 0x100) * (char)local_88 - (0xff < local_88);
    cStack_127 = (0 < sStack_86) * (sStack_86 < 0x100) * (char)sStack_86 - (0xff < sStack_86);
    cStack_126 = (0 < sStack_84) * (sStack_84 < 0x100) * (char)sStack_84 - (0xff < sStack_84);
    cStack_125 = (0 < sStack_82) * (sStack_82 < 0x100) * (char)sStack_82 - (0xff < sStack_82);
    cStack_124 = (0 < sStack_80) * (sStack_80 < 0x100) * (char)sStack_80 - (0xff < sStack_80);
    cStack_123 = (0 < sStack_7e) * (sStack_7e < 0x100) * (char)sStack_7e - (0xff < sStack_7e);
    cStack_122 = (0 < sStack_7c) * (sStack_7c < 0x100) * (char)sStack_7c - (0xff < sStack_7c);
    cStack_121 = (0 < sStack_7a) * (sStack_7a < 0x100) * (char)sStack_7a - (0xff < sStack_7a);
    cStack_120 = (0 < local_98) * (local_98 < 0x100) * (char)local_98 - (0xff < local_98);
    cStack_11f = (0 < sStack_96) * (sStack_96 < 0x100) * (char)sStack_96 - (0xff < sStack_96);
    cStack_11e = (0 < sStack_94) * (sStack_94 < 0x100) * (char)sStack_94 - (0xff < sStack_94);
    cStack_11d = (0 < sStack_92) * (sStack_92 < 0x100) * (char)sStack_92 - (0xff < sStack_92);
    cStack_11c = (0 < sStack_90) * (sStack_90 < 0x100) * (char)sStack_90 - (0xff < sStack_90);
    cStack_11b = (0 < sStack_8e) * (sStack_8e < 0x100) * (char)sStack_8e - (0xff < sStack_8e);
    cStack_11a = (0 < sStack_8c) * (sStack_8c < 0x100) * (char)sStack_8c - (0xff < sStack_8c);
    cStack_119 = (0 < sStack_8a) * (sStack_8a < 0x100) * (char)sStack_8a - (0xff < sStack_8a);
    local_138 = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
    cStack_137 = (0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6);
    cStack_136 = (0 < sStack_a4) * (sStack_a4 < 0x100) * (char)sStack_a4 - (0xff < sStack_a4);
    cStack_135 = (0 < sStack_a2) * (sStack_a2 < 0x100) * (char)sStack_a2 - (0xff < sStack_a2);
    cStack_134 = (0 < sStack_a0) * (sStack_a0 < 0x100) * (char)sStack_a0 - (0xff < sStack_a0);
    cStack_133 = (0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e - (0xff < sStack_9e);
    cStack_132 = (0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c - (0xff < sStack_9c);
    cStack_131 = (0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a);
    cStack_130 = (0 < local_b8) * (local_b8 < 0x100) * (char)local_b8 - (0xff < local_b8);
    cStack_12f = (0 < sStack_b6) * (sStack_b6 < 0x100) * (char)sStack_b6 - (0xff < sStack_b6);
    cStack_12e = (0 < sStack_b4) * (sStack_b4 < 0x100) * (char)sStack_b4 - (0xff < sStack_b4);
    cStack_12d = (0 < sStack_b2) * (sStack_b2 < 0x100) * (char)sStack_b2 - (0xff < sStack_b2);
    cStack_12c = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)sStack_b0 - (0xff < sStack_b0);
    cStack_12b = (0 < sStack_ae) * (sStack_ae < 0x100) * (char)sStack_ae - (0xff < sStack_ae);
    cStack_12a = (0 < sStack_ac) * (sStack_ac < 0x100) * (char)sStack_ac - (0xff < sStack_ac);
    cStack_129 = (0 < sStack_aa) * (sStack_aa < 0x100) * (char)sStack_aa - (0xff < sStack_aa);
    local_148 = (0 < local_c8) * (local_c8 < 0x100) * (char)local_c8 - (0xff < local_c8);
    cStack_147 = (0 < sStack_c6) * (sStack_c6 < 0x100) * (char)sStack_c6 - (0xff < sStack_c6);
    cStack_146 = (0 < sStack_c4) * (sStack_c4 < 0x100) * (char)sStack_c4 - (0xff < sStack_c4);
    cStack_145 = (0 < sStack_c2) * (sStack_c2 < 0x100) * (char)sStack_c2 - (0xff < sStack_c2);
    cStack_144 = (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)sStack_c0 - (0xff < sStack_c0);
    cStack_143 = (0 < sStack_be) * (sStack_be < 0x100) * (char)sStack_be - (0xff < sStack_be);
    cStack_142 = (0 < sStack_bc) * (sStack_bc < 0x100) * (char)sStack_bc - (0xff < sStack_bc);
    cStack_141 = (0 < sStack_ba) * (sStack_ba < 0x100) * (char)sStack_ba - (0xff < sStack_ba);
    cStack_140 = (0 < local_d8) * (local_d8 < 0x100) * (char)local_d8 - (0xff < local_d8);
    cStack_13f = (0 < sStack_d6) * (sStack_d6 < 0x100) * (char)sStack_d6 - (0xff < sStack_d6);
    cStack_13e = (0 < sStack_d4) * (sStack_d4 < 0x100) * (char)sStack_d4 - (0xff < sStack_d4);
    cStack_13d = (0 < sStack_d2) * (sStack_d2 < 0x100) * (char)sStack_d2 - (0xff < sStack_d2);
    cStack_13c = (0 < sStack_d0) * (sStack_d0 < 0x100) * (char)sStack_d0 - (0xff < sStack_d0);
    cStack_13b = (0 < sStack_ce) * (sStack_ce < 0x100) * (char)sStack_ce - (0xff < sStack_ce);
    cStack_13a = (0 < sStack_cc) * (sStack_cc < 0x100) * (char)sStack_cc - (0xff < sStack_cc);
    cStack_139 = (0 < sStack_ca) * (sStack_ca < 0x100) * (char)sStack_ca - (0xff < sStack_ca);
    local_158 = (0 < local_e8) * (local_e8 < 0x100) * (char)local_e8 - (0xff < local_e8);
    cStack_157 = (0 < sStack_e6) * (sStack_e6 < 0x100) * (char)sStack_e6 - (0xff < sStack_e6);
    cStack_156 = (0 < sStack_e4) * (sStack_e4 < 0x100) * (char)sStack_e4 - (0xff < sStack_e4);
    cStack_155 = (0 < sStack_e2) * (sStack_e2 < 0x100) * (char)sStack_e2 - (0xff < sStack_e2);
    cStack_154 = (0 < sStack_e0) * (sStack_e0 < 0x100) * (char)sStack_e0 - (0xff < sStack_e0);
    cStack_153 = (0 < sStack_de) * (sStack_de < 0x100) * (char)sStack_de - (0xff < sStack_de);
    cStack_152 = (0 < sStack_dc) * (sStack_dc < 0x100) * (char)sStack_dc - (0xff < sStack_dc);
    cStack_151 = (0 < sStack_da) * (sStack_da < 0x100) * (char)sStack_da - (0xff < sStack_da);
    cStack_150 = (0 < local_f8) * (local_f8 < 0x100) * (char)local_f8 - (0xff < local_f8);
    cStack_14f = (0 < sStack_f6) * (sStack_f6 < 0x100) * (char)sStack_f6 - (0xff < sStack_f6);
    cStack_14e = (0 < sStack_f4) * (sStack_f4 < 0x100) * (char)sStack_f4 - (0xff < sStack_f4);
    cStack_14d = (0 < sStack_f2) * (sStack_f2 < 0x100) * (char)sStack_f2 - (0xff < sStack_f2);
    cStack_14c = (0 < sStack_f0) * (sStack_f0 < 0x100) * (char)sStack_f0 - (0xff < sStack_f0);
    cStack_14b = (0 < sStack_ee) * (sStack_ee < 0x100) * (char)sStack_ee - (0xff < sStack_ee);
    cStack_14a = (0 < sStack_ec) * (sStack_ec < 0x100) * (char)sStack_ec - (0xff < sStack_ec);
    cStack_149 = (0 < sStack_ea) * (sStack_ea < 0x100) * (char)sStack_ea - (0xff < sStack_ea);
    PlanarTo24b_SSE2((__m128i *)&local_108,(__m128i *)&local_118,(__m128i *)&local_128,
                     (__m128i *)&local_138,(__m128i *)&local_148,(__m128i *)&local_158,dst);
    dst = dst + 0x60;
    lVar2 = lVar2 + 0x20;
    lVar3 = lVar3 + 0x10;
  }
  for (; (int)(uint)lVar2 < len; lVar2 = lVar2 + 1) {
    VP8YuvToRgb((uint)y[lVar2],(uint)*u_00,(uint)*v_00,dst);
    dst = dst + 3;
    uVar1 = (uint)lVar2 & 1;
    u_00 = u_00 + uVar1;
    v_00 = v_00 + uVar1;
  }
  return;
}

Assistant:

static void YuvToRgbRow_SSE2(const uint8_t* WEBP_RESTRICT y,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v,
                             uint8_t* WEBP_RESTRICT dst, int len) {
  int n;
  for (n = 0; n + 32 <= len; n += 32, dst += 32 * 3) {
    __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
    __m128i rgb0, rgb1, rgb2, rgb3, rgb4, rgb5;

    YUV420ToRGB_SSE2(y +  0, u +  0, v +  0, &R0, &G0, &B0);
    YUV420ToRGB_SSE2(y +  8, u +  4, v +  4, &R1, &G1, &B1);
    YUV420ToRGB_SSE2(y + 16, u +  8, v +  8, &R2, &G2, &B2);
    YUV420ToRGB_SSE2(y + 24, u + 12, v + 12, &R3, &G3, &B3);

    // Cast to 8b and store as RRRRGGGGBBBB.
    rgb0 = _mm_packus_epi16(R0, R1);
    rgb1 = _mm_packus_epi16(R2, R3);
    rgb2 = _mm_packus_epi16(G0, G1);
    rgb3 = _mm_packus_epi16(G2, G3);
    rgb4 = _mm_packus_epi16(B0, B1);
    rgb5 = _mm_packus_epi16(B2, B3);

    // Pack as RGBRGBRGBRGB.
    PlanarTo24b_SSE2(&rgb0, &rgb1, &rgb2, &rgb3, &rgb4, &rgb5, dst);

    y += 32;
    u += 16;
    v += 16;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToRgb(y[0], u[0], v[0], dst);
    dst += 3;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}